

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetNavIDWithRectRel(ImGuiID id,int nav_layer,ImRect *rect_rel)

{
  ImVec2 *pIVar1;
  ImGuiWindow *pIVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *g;
  
  pIVar4 = GImGui;
  GImGui->NavId = id;
  pIVar2 = pIVar4->NavWindow;
  pIVar2->NavLastIds[nav_layer] = id;
  IVar3 = rect_rel->Max;
  pIVar1 = &pIVar2->NavRectRel[nav_layer].Min;
  *pIVar1 = rect_rel->Min;
  pIVar1[1] = IVar3;
  pIVar4->NavMousePosDirty = true;
  pIVar4->NavDisableHighlight = false;
  pIVar4->NavDisableMouseHover = true;
  return;
}

Assistant:

void ImGui::SetNavIDWithRectRel(ImGuiID id, int nav_layer, const ImRect& rect_rel)
{
    ImGuiContext& g = *GImGui;
    SetNavID(id, nav_layer);
    g.NavWindow->NavRectRel[nav_layer] = rect_rel;
    g.NavMousePosDirty = true;
    g.NavDisableHighlight = false;
    g.NavDisableMouseHover = true;
}